

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

bool __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
::CheckDomainReturnFalseIfTrivial
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
           *this,PLPoints *result)

{
  bool bVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  int iVar2;
  CStringRef msg;
  undefined4 extraout_var;
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
  *in_RDI;
  CStringRef arg0;
  double dVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar4;
  PLPoints *this_02;
  vector<double,_std::allocator<double>_> *extraout_XMM0_Qa;
  PLPoints *in_stack_fffffffffffffe28;
  BasicCStringRef<char> *in_stack_fffffffffffffe30;
  PLPoints *this_03;
  vector<double,_std::allocator<double>_> *x;
  allocator_type *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  double *args_1;
  PLPoints local_159;
  allocator_type local_121;
  double local_120;
  double *local_118;
  undefined8 local_110;
  undefined1 local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  double local_b0;
  Error *local_a8;
  BasicCStringRef<char> local_a0 [7];
  double local_61 [12];
  Error *this_00;
  
  arg0.data_ = (char *)lbx(in_RDI);
  dVar3 = ubx(in_RDI);
  if ((double)arg0.data_ <= dVar3 + 1e-06) {
    this_01 = (vector<double,_std::allocator<double>_> *)lbx(in_RDI);
    dVar3 = ubx(in_RDI);
    bVar1 = (double)this_01 <= dVar3 - 1e-06;
    if (!bVar1) {
      dVar3 = lbx(in_RDI);
      dVar4 = ubx(in_RDI);
      local_120 = (dVar3 + dVar4) * 0.5;
      local_118 = &local_120;
      local_110 = 1;
      __a = &local_121;
      std::allocator<double>::allocator((allocator<double> *)0x72ebe1);
      __l._M_len._0_4_ = in_stack_fffffffffffffe70;
      __l._M_array = (iterator)in_stack_fffffffffffffe68;
      __l._M_len._4_4_ = in_stack_fffffffffffffe74;
      std::vector<double,_std::allocator<double>_>::vector(this_01,__l,__a);
      dVar3 = lbx(in_RDI);
      this_02 = (PLPoints *)ubx(in_RDI);
      (*in_RDI->_vptr_BasicPLApproximator[9])((dVar3 + (double)this_02) * 0.5);
      local_159.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._9_8_ =
           (long)&local_159.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
      local_159._17_8_ = 1;
      this_03 = &local_159;
      x = extraout_XMM0_Qa;
      std::allocator<double>::allocator((allocator<double> *)0x72ec95);
      __l_00._M_len._0_4_ = in_stack_fffffffffffffe70;
      __l_00._M_array = (iterator)in_stack_fffffffffffffe68;
      __l_00._M_len._4_4_ = in_stack_fffffffffffffe74;
      std::vector<double,_std::allocator<double>_>::vector(this_01,__l_00,__a);
      PLPoints::PLPoints(this_02,x,&this_03->x_);
      PLPoints::operator=(this_03,in_stack_fffffffffffffe28);
      PLPoints::~PLPoints(this_03);
      std::vector<double,_std::allocator<double>_>::~vector(&this_02->x_);
      std::allocator<double>::~allocator((allocator<double> *)0x72ed11);
      std::vector<double,_std::allocator<double>_>::~vector(&this_02->x_);
      std::allocator<double>::~allocator((allocator<double> *)0x72ed2b);
    }
    return bVar1;
  }
  local_b9 = 1;
  msg.data_ = (char *)__cxa_allocate_exception(0x18);
  args_1 = local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
             ,(allocator<char> *)in_stack_fffffffffffffe60);
  fmt::BasicCStringRef<char>::BasicCStringRef
            (local_a0,"PLApprox {}: empty argument domain [{}, {}]");
  iVar2 = (*in_RDI->_vptr_BasicPLApproximator[2])();
  this_00 = (Error *)CONCAT44(extraout_var,iVar2);
  local_a8 = this_00;
  local_b0 = lbx(in_RDI);
  iVar2 = (int)((ulong)local_b0 >> 0x20);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ubx(in_RDI);
  local_b8 = __lhs;
  fmt::format<char_const*,double,double>(arg0,(char **)in_RDI,args_1,(double *)msg.data_);
  std::operator+(__lhs,in_stack_fffffffffffffe60);
  fmt::BasicCStringRef<char>::BasicCStringRef
            (in_stack_fffffffffffffe30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe28);
  Error::Error(this_00,msg,iVar2);
  local_b9 = 0;
  __cxa_throw(msg.data_,&Error::typeinfo,Error::~Error);
}

Assistant:

bool BasicPLApproximator<FuncCon>::CheckDomainReturnFalseIfTrivial(
    PLPoints& result) {
  if (lbx() > ubx()+1e-6)
    MP_INFEAS(fmt::format("PLApprox {}: "
                          "empty argument domain [{}, {}]",
                          GetConTypeName(), lbx(), ubx()));
  /// Domain ~ single point
  if (lbx() > ubx()-1e-6) {
    result = { {(lbx()+ubx())/2.0}, {eval((lbx()+ubx())/2.0)} };
    return false;
  }
  return true;
}